

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGA.hpp
# Opt level: O3

void __thiscall
PCCompatible::CGA::CRTCOutputter::perform_bus_cycle_phase1(CRTCOutputter *this,BusState *state)

{
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  ScanTarget *pSVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  uint8_t *puVar8;
  int iVar9;
  OutputState OVar10;
  undefined4 extraout_var;
  
  bVar3 = state->hsync;
  if (this->previous_hsync == bVar3) {
    iVar6 = this->cycles_since_hsync + this->clock_divider;
    this->cycles_since_hsync = iVar6;
    bVar5 = iVar6 < 7;
  }
  else {
    this->cycles_since_hsync = 0;
    this->previous_hsync = bVar3;
    bVar5 = true;
  }
  OVar10 = Sync;
  if ((bVar3 == false) && (OVar10 = Sync, state->vsync == false)) {
    OVar10 = Pixels;
    if ((state->display_enable & (this->control_ & 8) >> 3) == 0) {
      OVar10 = (byte)((this->control_ & 4) == 0 & bVar5) | Border;
    }
  }
  if ((((OVar10 != this->output_state) || (this->active_pixels_per_tick != this->pixels_per_tick))
      || (this->active_clock_divider != this->clock_divider)) ||
     (iVar6 = this->count, 0x390 < iVar6 || this->active_border_colour != this->border_colour)) {
    iVar6 = this->count;
    if (iVar6 != 0) {
      switch(this->output_state) {
      case Sync:
        Outputs::CRT::CRT::output_sync(&this->crt,iVar6 * this->active_clock_divider);
        break;
      case Pixels:
        iVar7 = iVar6 * this->active_pixels_per_tick;
        iVar9 = iVar7 + 7;
        if (-1 < iVar7) {
          iVar9 = iVar7;
        }
        Outputs::CRT::CRT::output_data
                  (&this->crt,this->active_clock_divider * iVar6,(long)(iVar9 >> 3));
        this->pixels = (uint8_t *)0x0;
        this->pixel_pointer = (uint8_t *)0x0;
        break;
      case Border:
        iVar6 = iVar6 * this->active_clock_divider;
        if (this->active_border_colour == '\0') {
          Outputs::CRT::CRT::output_level<unsigned_char>(&this->crt,iVar6,'\0');
        }
        else {
          Outputs::CRT::CRT::output_blank(&this->crt,iVar6);
        }
        break;
      case ColourBurst:
        Outputs::CRT::CRT::output_colour_burst
                  (&this->crt,iVar6 * this->active_clock_divider,200,false,')');
      }
    }
    this->output_state = OVar10;
    uVar1 = this->clock_divider;
    uVar2 = this->pixels_per_tick;
    this->active_pixels_per_tick = uVar2;
    this->active_clock_divider = uVar1;
    this->active_border_colour = this->border_colour;
    this->count = 0;
    iVar6 = 0;
  }
  if (OVar10 != Pixels) {
    this->count = iVar6 + 8;
    return;
  }
  if (this->pixels == (uint8_t *)0x0) {
    pSVar4 = (this->crt).scan_target_;
    iVar6 = (*pSVar4->_vptr_ScanTarget[5])(pSVar4,0x140,1);
    puVar8 = (uint8_t *)CONCAT44(extraout_var,iVar6);
    (this->crt).allocated_data_length_ = -(ulong)(puVar8 == (uint8_t *)0x0) | 0x140;
    this->pixels = puVar8;
    this->pixel_pointer = puVar8;
    if (puVar8 == (uint8_t *)0x0) goto LAB_0038d622;
    if (this->count != 0) {
      Outputs::CRT::CRT::output_blank(&this->crt,this->count * this->active_clock_divider);
      this->count = 0;
      if (this->pixels == (uint8_t *)0x0) goto LAB_0038d622;
    }
  }
  if (state->cursor == true) {
    if ((long)this->pixels_per_tick != 0) {
      memset(this->pixel_pointer,0x3f,(long)this->pixels_per_tick);
    }
  }
  else if (this->mode_ == Text) {
    serialise_text(this,state);
  }
  else {
    serialise_pixels(this,state);
  }
  this->pixel_pointer = this->pixel_pointer + this->active_pixels_per_tick;
LAB_0038d622:
  iVar6 = this->count + 8;
  this->count = iVar6;
  if ((this->output_state == Pixels) && (this->pixel_pointer == this->pixels + 0x140)) {
    iVar7 = iVar6 * this->active_pixels_per_tick;
    iVar9 = iVar7 + 7;
    if (-1 < iVar7) {
      iVar9 = iVar7;
    }
    Outputs::CRT::CRT::output_data(&this->crt,this->active_clock_divider * iVar6,(long)(iVar9 >> 3))
    ;
    this->pixels = (uint8_t *)0x0;
    this->pixel_pointer = (uint8_t *)0x0;
    this->count = 0;
  }
  return;
}

Assistant:

void perform_bus_cycle_phase1(const Motorola::CRTC::BusState &state) {
				// Determine new output state.
				update_hsync(state.hsync);
				const OutputState new_state = implied_state(state);
				static constexpr uint8_t colour_phase = 200;

				// Upon either a state change or just having accumulated too much local time...
				if(
					new_state != output_state ||
					active_pixels_per_tick != pixels_per_tick ||
					active_clock_divider != clock_divider ||
					active_border_colour != border_colour ||
					count > 912
				) {
					// (1) flush preexisting state.
					if(count) {
						switch(output_state) {
							case OutputState::Sync:			crt.output_sync(count * active_clock_divider);							break;
							case OutputState::Border:
								if(active_border_colour) {
									crt.output_blank(count * active_clock_divider);
								} else {
									crt.output_level<uint8_t>(count * active_clock_divider, active_border_colour);
								}
							break;
							case OutputState::ColourBurst:	crt.output_colour_burst(count * active_clock_divider, colour_phase);	break;
							case OutputState::Pixels:		flush_pixels();															break;
						}
					}

					// (2) adopt new state.
					output_state = new_state;
					active_pixels_per_tick = pixels_per_tick;
					active_clock_divider = clock_divider;
					active_border_colour = border_colour;
					count = 0;
				}

				// Collect pixels if applicable.
				if(output_state == OutputState::Pixels) {
					if(!pixels) {
						pixel_pointer = pixels = crt.begin_data(DefaultAllocationSize);

						// Flush any period where pixels weren't recorded due to back pressure.
						if(pixels && count) {
							crt.output_blank(count * active_clock_divider);
							count = 0;
						}
					}

					if(pixels) {
						if(state.cursor) {
							std::fill(pixel_pointer, pixel_pointer + pixels_per_tick, 0x3f); // i.e. white.
						} else {
							if(mode_ == Mode::Text) {
								serialise_text(state);
							} else {
								serialise_pixels(state);
							}
						}
						pixel_pointer += active_pixels_per_tick;
					}
				}

				// Advance.
				count += 8;

				// Output pixel row prematurely if storage is exhausted.
				if(output_state == OutputState::Pixels && pixel_pointer == pixels + DefaultAllocationSize) {
					flush_pixels();
					count = 0;
				}
			}